

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brecovery.cpp
# Opt level: O0

size_t anon_unknown.dwarf_d28b::remainingSize(istream *input)

{
  size_t sVar1;
  long in_RDI;
  size_t size;
  pos_type end;
  pos_type pos;
  fpos<__mbstate_t> local_28;
  fpos<__mbstate_t> local_18;
  long local_8;
  
  local_8 = in_RDI;
  local_18 = (fpos<__mbstate_t>)std::istream::tellg();
  std::istream::seekg(local_8,_S_beg);
  local_28 = (fpos<__mbstate_t>)std::istream::tellg();
  sVar1 = std::fpos<__mbstate_t>::operator-(&local_28,&local_18);
  std::istream::seekg(local_8,local_18._M_off,local_18._M_state);
  return sVar1;
}

Assistant:

std::size_t remainingSize(std::istream& input)
{
  const auto pos = input.tellg();
  input.seekg(0, std::ios_base::end);
  const auto end = input.tellg();
  const std::size_t size = std::size_t(end - pos);
  input.seekg(pos);
  return size;
}